

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_inline.h
# Opt level: O1

_Bool xdr_opaque_auth_decode(XDR *xdrs,opaque_auth *oa,int32_t *buf)

{
  uint *puVar1;
  uint uVar2;
  _Bool _Var3;
  undefined8 uVar4;
  char *pcVar5;
  char *pcVar6;
  char local_24 [4];
  
  if (buf == (int32_t *)0x0) {
    puVar1 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar1) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,(uint32_t *)oa);
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar6 = "%s:%u ERROR oa_flavor";
        pcVar5 = "xdr_opaque_auth_decode";
        uVar4 = 0x87;
        goto LAB_00112238;
      }
    }
    else {
      uVar2 = *(uint *)xdrs->x_data;
      oa->oa_flavor =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)puVar1;
    }
    puVar1 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar1) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&oa->oa_length);
      if (!_Var3) {
        if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
          return false;
        }
        pcVar6 = "%s:%u ERROR oa_length";
        pcVar5 = "xdr_opaque_auth_decode";
        uVar4 = 0x8c;
        goto LAB_00112238;
      }
    }
    else {
      uVar2 = *(uint *)xdrs->x_data;
      oa->oa_length =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)puVar1;
    }
  }
  else {
    uVar2 = *buf;
    oa->oa_flavor = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = buf[1];
    oa->oa_length = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  }
  uVar2 = oa->oa_length;
  if (uVar2 == 0) {
    return true;
  }
  if (uVar2 < 0x191) {
    _Var3 = (*xdrs->x_ops->x_getbytes)(xdrs,oa->oa_body,uVar2);
    if (_Var3) {
      if ((uVar2 & 3) == 0) {
        return true;
      }
      _Var3 = (*xdrs->x_ops->x_getbytes)(xdrs,local_24,4 - (uVar2 & 3));
      if (_Var3) {
        return true;
      }
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR crud","xdr_opaque_decode",0x1c9);
      }
      if (_Var3) {
        return true;
      }
    }
    else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      pcVar6 = "%s:%u ERROR opaque";
      pcVar5 = "xdr_opaque_decode";
      uVar4 = 0x1b9;
LAB_00112238:
      (*__ntirpc_pkg_params.warnx_)(pcVar6,pcVar5,uVar4);
      return false;
    }
  }
  else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%u ERROR oa_length (%u) > %u","xdr_opaque_auth_decode_it",0x70,(ulong)uVar2,400);
    return false;
  }
  return false;
}

Assistant:

static inline bool
xdr_opaque_auth_decode(XDR *xdrs, struct opaque_auth *oa, int32_t *buf)
{
	if (buf != NULL) {
		oa->oa_flavor = IXDR_GET_ENUM(buf, enum_t);
		oa->oa_length = (u_int) IXDR_GET_U_INT32(buf);
	} else if (!xdr_getenum(xdrs, (enum_t *)&oa->oa_flavor)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_flavor",
			__func__, __LINE__);
		return (false);
	} else if (!xdr_getuint32(xdrs, &oa->oa_length)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_length",
			__func__, __LINE__);
		return (false);
	}

	if (oa->oa_length) {
		/* only call and alloc for > 0 length */
		return xdr_opaque_auth_decode_it(xdrs, oa);
	}
	return (true);	/* 0 length succeeds */
}